

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O2

Test * ElideMiddleNothingToElide::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001e6850;
  return g_current_test;
}

Assistant:

TEST(ElideMiddle, NothingToElide) {
  string input = "Nothing to elide in this short string.";
  EXPECT_EQ(input, ElideMiddle(input, 80));
  EXPECT_EQ(input, ElideMiddle(input, 38));
  EXPECT_EQ("", ElideMiddle(input, 0));
  EXPECT_EQ(".", ElideMiddle(input, 1));
  EXPECT_EQ("..", ElideMiddle(input, 2));
  EXPECT_EQ("...", ElideMiddle(input, 3));
}